

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O1

void __thiscall
FIX::MessageStoreExceptionWrapper::get
          (MessageStoreExceptionWrapper *this,SEQNUM begin,SEQNUM end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *msgs,bool *threw,IOException *ex)

{
  *threw = false;
  (**(code **)(**(long **)this + 0x18))();
  return;
}

Assistant:

void MessageStoreExceptionWrapper::get(
    SEQNUM begin,
    SEQNUM end,
    std::vector<std::string> &msgs,
    bool &threw,
    IOException &ex) const {
  threw = false;
  try {
    m_pStore->get(begin, end, msgs);
  } catch (IOException &e) {
    threw = true;
    ex = e;
  }
}